

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_FloodZones(void)

{
  int iVar1;
  ReverbContainer *pRVar2;
  ulong uVar3;
  uint zonenum;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = 0;
  zonenum = 0;
  iVar1 = numsectors;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    if (*(short *)((long)sectors->Portals + lVar5 + -0x14) == -1) {
      P_FloodZone((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar5),zonenum);
      iVar1 = numsectors;
      zonenum = zonenum + 1;
    }
    lVar5 = lVar5 + 0x268;
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)zonenum) {
    uVar4 = (long)(int)zonenum * 8;
  }
  numzones = zonenum;
  zones = (zone_t *)operator_new__(uVar4);
  pRVar2 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar2 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar2 = DefaultEnvironments[0];
  }
  uVar3 = 0;
  uVar4 = (ulong)zonenum;
  if ((int)zonenum < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    zones[uVar3].Environment = pRVar2;
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	numzones = z;
	zones = new zone_t[z];
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		zones[i].Environment = reverb;
	}
}